

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnmidi_opn2.cpp
# Opt level: O3

void __thiscall
OPN2::reset(OPN2 *this,int emulator,unsigned_long PCM_RATE,OPNFamily family,void *audioTickHandler)

{
  pointer pOVar1;
  pointer puVar2;
  pointer pAVar3;
  iterator __position;
  long *plVar4;
  byte bVar5;
  uint uVar6;
  VGMFileDumper *this_00;
  OPNChipBase *first;
  OpnTimbre *pOVar7;
  pointer pAVar8;
  size_type __new_size;
  pointer this_01;
  long lVar9;
  ulong uVar10;
  value_type local_68;
  value_type local_58;
  
  clearChips(this);
  pOVar1 = (this->m_insCache).super__Vector_base<OpnTimbre,_std::allocator<OpnTimbre>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_insCache).super__Vector_base<OpnTimbre,_std::allocator<OpnTimbre>_>._M_impl.
      super__Vector_impl_data._M_finish != pOVar1) {
    (this->m_insCache).super__Vector_base<OpnTimbre,_std::allocator<OpnTimbre>_>._M_impl.
    super__Vector_impl_data._M_finish = pOVar1;
  }
  puVar2 = (this->m_regLFOSens).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->m_regLFOSens).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_finish != puVar2) {
    (this->m_regLFOSens).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  if ((emulator == 7) && (2 < this->m_numChips)) {
    this->m_numChips = 2;
  }
  pAVar8 = (this->m_chips).
           super__Vector_base<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>,_std::allocator<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pAVar3 = (this->m_chips).
           super__Vector_base<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>,_std::allocator<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_01 = pAVar8;
  if (pAVar3 != pAVar8) {
    do {
      AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>::reset
                (this_01,(OPNChipBase *)0x0);
      this_01 = this_01 + 1;
    } while (this_01 != pAVar3);
    (this->m_chips).
    super__Vector_base<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>,_std::allocator<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pAVar8;
  }
  local_68.m_p = (OPNChipBase *)0x0;
  local_68.m_counter = (size_t *)0x0;
  std::
  vector<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>,_std::allocator<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>_>_>
  ::resize(&this->m_chips,(ulong)this->m_numChips,&local_68);
  AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>::reset
            (&local_68,(OPNChipBase *)0x0);
  this->m_loopEndHook = (_func_void_void_ptr *)0x0;
  this->m_loopEndHookData = (void *)0x0;
  this->m_loopStartHook = (_func_void_void_ptr *)0x0;
  this->m_loopStartHookData = (void *)0x0;
  pAVar8 = (this->m_chips).
           super__Vector_base<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>,_std::allocator<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_chips).
      super__Vector_base<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>,_std::allocator<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pAVar8) {
    if (8 < (uint)emulator) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]adljack/thirdparty/libOPNMIDI/src/opnmidi_opn2.cpp"
                    ,0x27e,"void OPN2::reset(int, unsigned long, OPNFamily, void *)");
    }
    lVar9 = 0;
    uVar10 = 0;
    do {
      if ((uint)emulator < 9) {
        (*(code *)(&DAT_001ec040 + *(int *)(&DAT_001ec040 + (ulong)(uint)emulator * 4)))();
        return;
      }
      this_00 = (VGMFileDumper *)operator_new(0x4a0);
      if (uVar10 == 0) {
        first = (OPNChipBase *)0x0;
      }
      else {
        first = pAVar8->m_p;
      }
      VGMFileDumper::VGMFileDumper(this_00,family,(uint32_t)uVar10,first);
      if (uVar10 == 0) {
        this->m_loopStartHook = VGMFileDumper::loopStartHook;
        this->m_loopStartHookData = this_00;
        this->m_loopEndHook = VGMFileDumper::loopEndHook;
        this->m_loopEndHookData = this_00;
      }
      AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>::reset
                ((AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_> *)
                 ((long)&((this->m_chips).
                          super__Vector_base<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>,_std::allocator<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_p + lVar9),
                 (OPNChipBase *)this_00);
      (this_00->super_OPNChipBaseBufferedT<VGMFileDumper,_256U>).super_OPNChipBaseT<VGMFileDumper>.
      super_OPNChipBase.m_id = (uint32_t)uVar10;
      uVar6 = (*(this_00->super_OPNChipBaseBufferedT<VGMFileDumper,_256U>).
                super_OPNChipBaseT<VGMFileDumper>.super_OPNChipBase._vptr_OPNChipBase[3])(this_00);
      (*(this_00->super_OPNChipBaseBufferedT<VGMFileDumper,_256U>).super_OPNChipBaseT<VGMFileDumper>
        .super_OPNChipBase._vptr_OPNChipBase[7])(this_00,PCM_RATE,(ulong)uVar6);
      if (this->m_runAtPcmRate == true) {
        (*(this_00->super_OPNChipBaseBufferedT<VGMFileDumper,_256U>).
          super_OPNChipBaseT<VGMFileDumper>.super_OPNChipBase._vptr_OPNChipBase[6])(this_00,1);
      }
      family = (*(this_00->super_OPNChipBaseBufferedT<VGMFileDumper,_256U>).
                 super_OPNChipBaseT<VGMFileDumper>.super_OPNChipBase._vptr_OPNChipBase[2])(this_00);
      uVar10 = uVar10 + 1;
      pAVar8 = (this->m_chips).
               super__Vector_base<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>,_std::allocator<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar9 = lVar9 + 0x10;
    } while (uVar10 < (ulong)((long)(this->m_chips).
                                    super__Vector_base<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>,_std::allocator<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar8 >> 4))
    ;
  }
  this->m_chipFamily = family;
  uVar6 = this->m_numChips * 6;
  __new_size = (size_type)uVar6;
  this->m_numChannels = uVar6;
  local_58.OPS[2].data[2] = '\0';
  local_58.OPS[2].data[3] = '\0';
  local_58.OPS[2].data[4] = '\0';
  local_58.OPS[2].data[5] = '\0';
  local_58.OPS[2].data[6] = '\0';
  local_58.OPS[3].data[0] = '\0';
  local_58.OPS[3].data[1] = '\0';
  local_58.OPS[3].data[2] = '\0';
  local_58.OPS[3].data[3] = '\0';
  local_58.OPS[3].data[4] = '\0';
  local_58.OPS[3].data[5] = '\0';
  local_58.OPS[3].data[6] = '\0';
  local_58.fbalg = '\0';
  local_58.lfosens = '\0';
  local_58.noteOffset = 0;
  local_58.OPS[0].data[0] = '\0';
  local_58.OPS[0].data[1] = '\0';
  local_58.OPS[0].data[2] = '\0';
  local_58.OPS[0].data[3] = '\0';
  local_58.OPS[0].data[4] = '\0';
  local_58.OPS[0].data[5] = '\0';
  local_58.OPS[0].data[6] = '\0';
  local_58.OPS[1].data[0] = '\0';
  local_58.OPS[1].data[1] = '\0';
  local_58.OPS[1].data[2] = '\0';
  local_58.OPS[1].data[3] = '\0';
  local_58.OPS[1].data[4] = '\0';
  local_58.OPS[1].data[5] = '\0';
  local_58.OPS[1].data[6] = '\0';
  local_58.OPS[2].data[0] = '\0';
  local_58.OPS[2].data[1] = '\0';
  pOVar1 = (this->m_insCache).super__Vector_base<OpnTimbre,_std::allocator<OpnTimbre>_>._M_impl.
           super__Vector_impl_data._M_start;
  __position._M_current =
       (this->m_insCache).super__Vector_base<OpnTimbre,_std::allocator<OpnTimbre>_>._M_impl.
       super__Vector_impl_data._M_finish;
  uVar10 = (long)__position._M_current - (long)pOVar1 >> 5;
  if (__new_size < uVar10 || __new_size - uVar10 == 0) {
    if ((__new_size < uVar10) && (pOVar7 = pOVar1 + __new_size, __position._M_current != pOVar7)) {
      (this->m_insCache).super__Vector_base<OpnTimbre,_std::allocator<OpnTimbre>_>._M_impl.
      super__Vector_impl_data._M_finish = pOVar7;
    }
  }
  else {
    std::vector<OpnTimbre,_std::allocator<OpnTimbre>_>::_M_fill_insert
              (&this->m_insCache,__position,__new_size - uVar10,&local_58);
    __new_size = (size_type)this->m_numChannels;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->m_regLFOSens,__new_size,'\0');
  bVar5 = this->m_lfoFrequency & 7 | this->m_lfoEnable << 3;
  this->m_regLFOSetup = bVar5;
  if (this->m_numChips != 0) {
    lVar9 = 0;
    uVar10 = 0;
    do {
      plVar4 = *(long **)((long)&((this->m_chips).
                                  super__Vector_base<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>,_std::allocator<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_p + lVar9);
      (**(code **)(*plVar4 + 0x58))(plVar4,0,0x22,bVar5);
      plVar4 = *(long **)((long)&((this->m_chips).
                                  super__Vector_base<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>,_std::allocator<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_p + lVar9);
      (**(code **)(*plVar4 + 0x58))(plVar4,0,0x27,0);
      plVar4 = *(long **)((long)&((this->m_chips).
                                  super__Vector_base<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>,_std::allocator<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_p + lVar9);
      (**(code **)(*plVar4 + 0x58))(plVar4,0,0x2b,0);
      plVar4 = *(long **)((long)&((this->m_chips).
                                  super__Vector_base<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>,_std::allocator<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_p + lVar9);
      (**(code **)(*plVar4 + 0x58))(plVar4,0,0x28,0);
      plVar4 = *(long **)((long)&((this->m_chips).
                                  super__Vector_base<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>,_std::allocator<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_p + lVar9);
      (**(code **)(*plVar4 + 0x58))(plVar4,0,0x28,1);
      plVar4 = *(long **)((long)&((this->m_chips).
                                  super__Vector_base<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>,_std::allocator<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_p + lVar9);
      (**(code **)(*plVar4 + 0x58))(plVar4,0,0x28,2);
      plVar4 = *(long **)((long)&((this->m_chips).
                                  super__Vector_base<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>,_std::allocator<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_p + lVar9);
      (**(code **)(*plVar4 + 0x58))(plVar4,0,0x28,4);
      plVar4 = *(long **)((long)&((this->m_chips).
                                  super__Vector_base<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>,_std::allocator<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_p + lVar9);
      (**(code **)(*plVar4 + 0x58))(plVar4,0,0x28,5);
      plVar4 = *(long **)((long)&((this->m_chips).
                                  super__Vector_base<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>,_std::allocator<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_p + lVar9);
      (**(code **)(*plVar4 + 0x58))(plVar4,0,0x28,6);
      uVar10 = uVar10 + 1;
      lVar9 = lVar9 + 0x10;
    } while (uVar10 < this->m_numChips);
  }
  silenceAll(this);
  if (this->m_loopStartHook != (_func_void_void_ptr *)0x0) {
    (*this->m_loopStartHook)(this->m_loopStartHookData);
  }
  return;
}

Assistant:

void OPN2::reset(int emulator, unsigned long PCM_RATE, OPNFamily family, void *audioTickHandler)
{
#if !defined(ADLMIDI_AUDIO_TICK_HANDLER)
    ADL_UNUSED(audioTickHandler);
#endif
    clearChips();
    m_insCache.clear();
    m_regLFOSens.clear();
#ifdef OPNMIDI_MIDI2VGM
    if(emulator == OPNMIDI_VGM_DUMPER && (m_numChips > 2))
        m_numChips = 2;// VGM Dumper can't work in multichip mode
#endif
    m_chips.clear();
    m_chips.resize(m_numChips, AdlMIDI_SPtr<OPNChipBase>());

#ifdef OPNMIDI_MIDI2VGM
    m_loopStartHook = NULL;
    m_loopStartHookData = NULL;
    m_loopEndHook = NULL;
    m_loopEndHookData = NULL;
#endif

    for(size_t i = 0; i < m_chips.size(); i++)
    {
        OPNChipBase *chip = NULL;

        switch(emulator)
        {
        default:
            assert(false);
            abort();
#ifndef OPNMIDI_DISABLE_MAME_EMULATOR
        case OPNMIDI_EMU_MAME:
            chip = new MameOPN2(family);
            break;
#endif
#ifndef OPNMIDI_DISABLE_NUKED_EMULATOR
        case OPNMIDI_EMU_NUKED_YM3438:
            chip = new NukedOPN2(family, true);
            break;
        case OPNMIDI_EMU_NUKED_YM2612:
            chip = new NukedOPN2(family, false);
            break;
#endif
#ifndef OPNMIDI_DISABLE_GENS_EMULATOR
        case OPNMIDI_EMU_GENS:
            chip = new GensOPN2(family);
            break;
#endif
#ifndef OPNMIDI_DISABLE_YMFM_EMULATOR
        case OPNMIDI_EMU_YMFM_OPN2:
            chip = new YmFmOPN2(family);
            break;
#endif
//#ifndef OPNMIDI_DISABLE_GX_EMULATOR
//        case OPNMIDI_EMU_GX:
//            chip = new GXOPN2(family);
//            break;
//#endif
#ifndef OPNMIDI_DISABLE_NP2_EMULATOR
        case OPNMIDI_EMU_NP2:
            chip = new NP2OPNA<>(family);
            break;
#endif
#ifndef OPNMIDI_DISABLE_MAME_2608_EMULATOR
        case OPNMIDI_EMU_MAME_2608:
            chip = new MameOPNA(family);
            break;
#endif
#ifndef OPNMIDI_DISABLE_YMFM_EMULATOR
        case OPNMIDI_EMU_YMFM_OPNA:
            chip = new YmFmOPNA(family);
            break;
#endif
//#ifndef OPNMIDI_DISABLE_PMDWIN_EMULATOR
//        case OPNMIDI_EMU_PMDWIN:
//            chip = new PMDWinOPNA(family);
//            break;
//#endif
#ifdef OPNMIDI_MIDI2VGM
        case OPNMIDI_VGM_DUMPER:
            chip = new VGMFileDumper(family, i, (i == 0 ? NULL : m_chips[0].get()));
            if(i == 0)//Set hooks for first chip only
            {
                m_loopStartHook = &VGMFileDumper::loopStartHook;
                m_loopStartHookData = chip;
                m_loopEndHook  = &VGMFileDumper::loopEndHook;
                m_loopEndHookData = chip;
            }
            break;
#endif
        }

        m_chips[i].reset(chip);
        chip->setChipId(static_cast<uint32_t>(i));
        chip->setRate(static_cast<uint32_t>(PCM_RATE), chip->nativeClockRate());

        if(m_runAtPcmRate)
            chip->setRunningAtPcmRate(true);

#if defined(ADLMIDI_AUDIO_TICK_HANDLER)
        chip->setAudioTickHandlerInstance(audioTickHandler);
#endif
        family = chip->family();
    }

    m_chipFamily = family;
    m_numChannels = m_numChips * 6;
    m_insCache.resize(m_numChannels,   m_emptyInstrument.op[0]);
    m_regLFOSens.resize(m_numChannels,    0);

    uint8_t regLFOSetup = (m_lfoEnable ? 8 : 0) | (m_lfoFrequency & 7);
    m_regLFOSetup = regLFOSetup;

    for(size_t chip = 0; chip < m_numChips; ++chip)
    {
        writeReg(chip, 0, 0x22, regLFOSetup);//push current LFO state
        writeReg(chip, 0, 0x27, 0x00);  //set Channel 3 normal mode
        writeReg(chip, 0, 0x2B, 0x00);  //Disable DAC
        //Shut up all channels
        writeReg(chip, 0, 0x28, 0x00); //Note Off 0 channel
        writeReg(chip, 0, 0x28, 0x01); //Note Off 1 channel
        writeReg(chip, 0, 0x28, 0x02); //Note Off 2 channel
        writeReg(chip, 0, 0x28, 0x04); //Note Off 3 channel
        writeReg(chip, 0, 0x28, 0x05); //Note Off 4 channel
        writeReg(chip, 0, 0x28, 0x06); //Note Off 5 channel
    }

    silenceAll();
#ifdef OPNMIDI_MIDI2VGM
    if(m_loopStartHook) // Post-initialization Loop Start hook (fix for loop edge passing clicks)
        m_loopStartHook(m_loopStartHookData);
#endif
}